

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O2

char * Curl_inet_ntop(int af,void *src,char *buf,size_t size)

{
  size_t sVar1;
  int *piVar2;
  char local_28 [16];
  
  if (af == 2) {
    local_28[0] = '\0';
    curl_msnprintf(local_28,0x10,"%d.%d.%d.%d",(ulong)*src,(ulong)*(byte *)((long)src + 1),
                   (ulong)*(byte *)((long)src + 2),(uint)*(byte *)((long)src + 3));
    sVar1 = strlen(local_28);
    if (sVar1 != 0 && sVar1 < size) {
      strcpy(buf,local_28);
      return buf;
    }
    piVar2 = __errno_location();
    *piVar2 = 0x1c;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x61;
  }
  return (char *)0x0;
}

Assistant:

char *Curl_inet_ntop(int af, const void *src, char *buf, size_t size)
{
  switch (af) {
  case AF_INET:
    return inet_ntop4((const unsigned char*)src, buf, size);
#ifdef ENABLE_IPV6
  case AF_INET6:
    return inet_ntop6((const unsigned char*)src, buf, size);
#endif
  default:
    SET_ERRNO(EAFNOSUPPORT);
    return NULL;
  }
}